

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddImage
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *p_min,ImVec2 *p_max,ImVec2 *uv_min,
          ImVec2 *uv_max,ImU32 col)

{
  ImVec2 *in_RCX;
  ImVec2 *in_RDX;
  ImVec2 *in_RSI;
  ImDrawList *in_RDI;
  undefined8 in_R8;
  ImDrawList *in_R9;
  bool bVar1;
  ImDrawList *unaff_retaddr;
  uint in_stack_00000008;
  bool push_texture_id;
  ImTextureID in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc8;
  undefined3 in_stack_ffffffffffffffcc;
  uint idx_count;
  ImU32 col_00;
  ImDrawList *a;
  
  col_00 = (ImU32)((ulong)in_R8 >> 0x20);
  if ((in_stack_00000008 & 0xff000000) != 0) {
    bVar1 = in_RSI != (ImVec2 *)(in_RDI->_CmdHeader).TextureId;
    idx_count = CONCAT13(bVar1,in_stack_ffffffffffffffcc);
    a = in_RDI;
    if (bVar1) {
      PushTextureID(in_RDI,in_stack_ffffffffffffffb8);
    }
    PrimReserve(in_R9,idx_count,in_stack_ffffffffffffffc8);
    PrimRectUV(unaff_retaddr,(ImVec2 *)a,in_RSI,in_RDX,in_RCX,col_00);
    if ((idx_count & 0x1000000) != 0) {
      PopTextureID(in_RDI);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddImage(ImTextureID user_texture_id, const ImVec2& p_min, const ImVec2& p_max, const ImVec2& uv_min, const ImVec2& uv_max, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    const bool push_texture_id = user_texture_id != _CmdHeader.TextureId;
    if (push_texture_id)
        PushTextureID(user_texture_id);

    PrimReserve(6, 4);
    PrimRectUV(p_min, p_max, uv_min, uv_max, col);

    if (push_texture_id)
        PopTextureID();
}